

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QTimeZonePrivate::Data>::emplace<QTimeZonePrivate::Data>
          (QMovableArrayOps<QTimeZonePrivate::Data> *this,qsizetype i,Data *args)

{
  Data **ppDVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_80;
  Data tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
           super_QArrayDataPointer<QTimeZonePrivate::Data>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type_conflict)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
        super_QArrayDataPointer<QTimeZonePrivate::Data>.size == i) {
      qVar5 = QArrayDataPointer<QTimeZonePrivate::Data>::freeSpaceAtEnd
                        ((QArrayDataPointer<QTimeZonePrivate::Data> *)this);
      if (qVar5 == 0) goto LAB_003b7c63;
      QTimeZonePrivate::Data::Data
                ((this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
                 super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr +
                 (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
                 super_QArrayDataPointer<QTimeZonePrivate::Data>.size,args);
LAB_003b7d52:
      pqVar2 = &(this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
                super_QArrayDataPointer<QTimeZonePrivate::Data>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_003b7d11;
    }
LAB_003b7c63:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QTimeZonePrivate::Data>::freeSpaceAtBegin
                        ((QArrayDataPointer<QTimeZonePrivate::Data> *)this);
      if (qVar5 != 0) {
        QTimeZonePrivate::Data::Data
                  ((this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
                   super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr + -1,args);
        ppDVar1 = &(this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
                   super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr;
        *ppDVar1 = *ppDVar1 + -1;
        goto LAB_003b7d52;
      }
    }
  }
  tmp._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.abbreviation.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.atMSecsSinceEpoch = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  tmp.abbreviation.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.abbreviation.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QTimeZonePrivate::Data::Data(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
          super_QArrayDataPointer<QTimeZonePrivate::Data>.size != 0;
  QArrayDataPointer<QTimeZonePrivate::Data>::detachAndGrow
            ((QArrayDataPointer<QTimeZonePrivate::Data> *)this,(uint)(i == 0 && bVar6),1,
             (Data **)0x0,(QArrayDataPointer<QTimeZonePrivate::Data> *)0x0);
  if (i == 0 && bVar6) {
    QTimeZonePrivate::Data::Data
              ((this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
               super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr + -1,&tmp);
    ppDVar1 = &(this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
               super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr;
    *ppDVar1 = *ppDVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
              super_QArrayDataPointer<QTimeZonePrivate::Data>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<QTimeZonePrivate::Data> *)this,i,1);
    QTimeZonePrivate::Data::Data(local_80.displaceFrom,&tmp);
    local_80.displaceFrom = local_80.displaceFrom + 1;
    (local_80.data)->size = (local_80.data)->size + local_80.nInserts;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tmp);
LAB_003b7d11:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }